

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5SegIterReverseInitPage(Fts5Index *p,Fts5SegIter *pIter)

{
  int iVar1;
  u8 *puVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int *pOld;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  int nPos;
  u64 iDelta;
  int local_48;
  int local_44;
  u64 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = p->pConfig->eDetail;
  uVar12 = pIter->iLeafOffset;
  iVar11 = pIter->pLeaf->szLeaf;
  puVar2 = pIter->pLeaf->p;
  iVar4 = pIter->iEndofDoclist;
  if (iVar11 < pIter->iEndofDoclist) {
    iVar4 = iVar11;
  }
  lVar8 = 0;
  uVar10 = uVar12 & 0xffffffff;
  do {
    iVar11 = (int)uVar12;
    local_40 = 0;
    iVar9 = (int)uVar10;
    lVar7 = (long)iVar9;
    if (iVar1 == 1) {
      iVar5 = iVar9;
      if ((iVar9 < iVar4) && (puVar2[lVar7] == '\0')) {
        iVar6 = (int)(lVar7 + 1);
        iVar5 = iVar6;
        if ((iVar6 < iVar4) && (iVar5 = iVar9 + 2, puVar2[lVar7 + 1] != '\0')) {
          iVar5 = iVar6;
        }
      }
    }
    else {
      local_44 = -0x55555556;
      iVar5 = fts5GetPoslistSize(puVar2 + lVar7,&local_44,&local_48);
      iVar5 = iVar5 + iVar9 + local_44;
    }
    if (iVar4 <= iVar5) goto LAB_001c58f1;
    bVar3 = sqlite3Fts5GetVarint(puVar2 + iVar5,&local_40);
    pIter->iRowid = pIter->iRowid + local_40;
    iVar9 = pIter->nRowidOffset;
    pOld = pIter->aRowidOffset;
    if (iVar9 <= lVar8) {
      pOld = (int *)sqlite3_realloc64(pOld,(long)iVar9 * 4 + 0x20);
      if (pOld == (int *)0x0) {
        p->rc = 7;
LAB_001c58f1:
        pIter->iRowidOffset = (int)lVar8;
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        fts5SegIterLoadNPos(p,pIter);
        return;
      }
      pIter->aRowidOffset = pOld;
      pIter->nRowidOffset = iVar9 + 8;
      iVar11 = (int)pIter->iLeafOffset;
    }
    uVar10 = (ulong)(iVar5 + (uint)bVar3);
    pOld[lVar8] = iVar11;
    lVar8 = lVar8 + 1;
    uVar12 = (ulong)(int)(iVar5 + (uint)bVar3);
    pIter->iLeafOffset = uVar12;
  } while( true );
}

Assistant:

static void fts5SegIterReverseInitPage(Fts5Index *p, Fts5SegIter *pIter){
  int eDetail = p->pConfig->eDetail;
  int n = pIter->pLeaf->szLeaf;
  int i = pIter->iLeafOffset;
  u8 *a = pIter->pLeaf->p;
  int iRowidOffset = 0;

  if( n>pIter->iEndofDoclist ){
    n = pIter->iEndofDoclist;
  }

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  while( 1 ){
    u64 iDelta = 0;

    if( eDetail==FTS5_DETAIL_NONE ){
      /* todo */
      if( i<n && a[i]==0 ){
        i++;
        if( i<n && a[i]==0 ) i++;
      }
    }else{
      int nPos;
      int bDummy;
      i += fts5GetPoslistSize(&a[i], &nPos, &bDummy);
      i += nPos;
    }
    if( i>=n ) break;
    i += fts5GetVarint(&a[i], &iDelta);
    pIter->iRowid += iDelta;

    /* If necessary, grow the pIter->aRowidOffset[] array. */
    if( iRowidOffset>=pIter->nRowidOffset ){
      int nNew = pIter->nRowidOffset + 8;
      int *aNew = (int*)sqlite3_realloc64(pIter->aRowidOffset,nNew*sizeof(int));
      if( aNew==0 ){
        p->rc = SQLITE_NOMEM;
        break;
      }
      pIter->aRowidOffset = aNew;
      pIter->nRowidOffset = nNew;
    }

    pIter->aRowidOffset[iRowidOffset++] = pIter->iLeafOffset;
    pIter->iLeafOffset = i;
  }
  pIter->iRowidOffset = iRowidOffset;
  fts5SegIterLoadNPos(p, pIter);
}